

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall
spv::Builder::makeSwitch
          (Builder *this,Id selector,uint control,int numSegments,Vector<int> *caseValues,
          Vector<int> *valueIndexToSegment,int defaultSegment,Vector<Block_*> *segmentBlocks)

{
  Vector<Id> *this_00;
  iterator *piVar1;
  Function *parent;
  _Elt_pointer ppBVar2;
  Vector<int> *pVVar3;
  Block *pBVar4;
  Instruction *instruction;
  Block **ppBVar5;
  pointer piVar6;
  uint *puVar7;
  pointer ppBVar8;
  Instruction *raw_instruction;
  Id IVar9;
  iterator iVar10;
  long lVar11;
  Id local_5c;
  Block *local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  uint local_48;
  Id local_44;
  Block *local_40;
  Vector<int> *local_38;
  
  parent = this->buildPoint->parent;
  local_48 = control;
  local_44 = selector;
  local_38 = valueIndexToSegment;
  if (0 < numSegments) {
    do {
      pBVar4 = (Block *)::dxil_spv::allocate_in_thread(0x78);
      IVar9 = this->uniqueId + 1;
      this->uniqueId = IVar9;
      Block::Block(pBVar4,IVar9,parent);
      local_58 = pBVar4;
      std::vector<spv::Block*,dxil_spv::ThreadLocalAllocator<spv::Block*>>::
      emplace_back<spv::Block*>
                ((vector<spv::Block*,dxil_spv::ThreadLocalAllocator<spv::Block*>> *)segmentBlocks,
                 &local_58);
      numSegments = numSegments + -1;
    } while (numSegments != 0);
  }
  pBVar4 = (Block *)::dxil_spv::allocate_in_thread(0x78);
  IVar9 = this->uniqueId + 1;
  this->uniqueId = IVar9;
  Block::Block(pBVar4,IVar9,parent);
  local_58 = pBVar4;
  local_40 = pBVar4;
  createSelectionMerge(this,pBVar4,local_48);
  instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction->resultId = 0;
  instruction->typeId = 0;
  instruction->opCode = OpSwitch;
  this_00 = &instruction->operands;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instruction->block = (Block *)0x0;
  local_5c = local_44;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
             (iterator)0x0,&local_5c);
  ppBVar5 = (segmentBlocks->
            super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>)._M_impl
            .super__Vector_impl_data._M_start + (uint)defaultSegment;
  if (defaultSegment < 0) {
    ppBVar5 = &local_58;
  }
  iVar10._M_current =
       (instruction->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pBVar4 = *ppBVar5;
  local_5c = *(uint *)((long)(((pBVar4->instructions).
                               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t + 8);
  if (iVar10._M_current ==
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar10,
               &local_5c);
  }
  else {
    *iVar10._M_current = local_5c;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar10._M_current + 1;
  }
  Block::addPredecessor(pBVar4,this->buildPoint);
  pVVar3 = local_38;
  piVar6 = (caseValues->super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(caseValues->
                              super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl
                              .super__Vector_impl_data._M_finish - (long)piVar6) >> 2)) {
    lVar11 = 0;
    do {
      local_5c = piVar6[lVar11];
      iVar10._M_current =
           (instruction->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar7 = (instruction->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar10._M_current == puVar7) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
                   iVar10,&local_5c);
        iVar10._M_current =
             (instruction->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        puVar7 = (instruction->operands).
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar10._M_current = local_5c;
        iVar10._M_current = iVar10._M_current + 1;
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current;
      }
      piVar6 = (pVVar3->super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      ppBVar8 = (segmentBlocks->
                super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_5c = *(uint *)(**(long **)&(ppBVar8[piVar6[lVar11]]->instructions).
                                       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                       ._M_impl.super__Vector_impl_data + 8);
      if (iVar10._M_current == puVar7) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
                   iVar10,&local_5c);
        piVar6 = (pVVar3->super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        ppBVar8 = (segmentBlocks->
                  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *iVar10._M_current = local_5c;
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
      }
      Block::addPredecessor(ppBVar8[piVar6[lVar11]],this->buildPoint);
      lVar11 = lVar11 + 1;
      piVar6 = (caseValues->super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar11 < (int)((ulong)((long)(caseValues->
                                          super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)piVar6
                                   ) >> 2));
  }
  pBVar4 = this->buildPoint;
  local_50._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar4->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
  instruction->block = pBVar4;
  if (instruction->resultId != 0) {
    Module::mapInstruction(pBVar4->parent->parent,instruction);
  }
  pBVar4 = local_40;
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Instruction[1])();
  }
  local_50._M_head_impl = (Instruction *)0x0;
  ppBVar2 = (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar2 ==
      (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<spv::Block*,std::allocator<spv::Block*>>::_M_push_back_aux<spv::Block*const&>
              ((deque<spv::Block*,std::allocator<spv::Block*>> *)&this->switchMerges,&local_58);
  }
  else {
    *ppBVar2 = pBVar4;
    piVar1 = &(this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void Builder::makeSwitch(Id selector, unsigned int control, int numSegments, const dxil_spv::Vector<int>& caseValues,
                         const dxil_spv::Vector<int>& valueIndexToSegment, int defaultSegment,
                         dxil_spv::Vector<Block*>& segmentBlocks)
{
    Function& function = buildPoint->getParent();

    // make all the blocks
    for (int s = 0; s < numSegments; ++s)
        segmentBlocks.push_back(new Block(getUniqueId(), function));

    Block* mergeBlock = new Block(getUniqueId(), function);

    // make and insert the switch's selection-merge instruction
    createSelectionMerge(mergeBlock, control);

    // make the switch instruction
    Instruction* switchInst = new Instruction(NoResult, NoType, OpSwitch);
    switchInst->addIdOperand(selector);
    auto defaultOrMerge = (defaultSegment >= 0) ? segmentBlocks[defaultSegment] : mergeBlock;
    switchInst->addIdOperand(defaultOrMerge->getId());
    defaultOrMerge->addPredecessor(buildPoint);
    for (int i = 0; i < (int)caseValues.size(); ++i) {
        switchInst->addImmediateOperand(caseValues[i]);
        switchInst->addIdOperand(segmentBlocks[valueIndexToSegment[i]]->getId());
        segmentBlocks[valueIndexToSegment[i]]->addPredecessor(buildPoint);
    }
    buildPoint->addInstruction(std::unique_ptr<Instruction>(switchInst));

    // push the merge block
    switchMerges.push(mergeBlock);
}